

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::
InitializeKeyValue<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (MapFieldBase *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          basic_string_view<char,_std::char_traits<char>_> *init)

{
  char *pcVar1;
  size_t sVar2;
  Arena *pAVar3;
  ThreadSafeArena *this_00;
  
  pcVar1 = init->_M_str;
  sVar2 = init->_M_len;
  (v->_M_dataplus)._M_p = (pointer)&v->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)v,pcVar1,pcVar1 + sVar2);
  pAVar3 = arena(this);
  if (pAVar3 != (Arena *)0x0) {
    this_00 = &arena(this)->impl_;
    ThreadSafeArena::AddCleanup(this_00,v,cleanup::arena_destruct_object<std::__cxx11::string>);
    return;
  }
  return;
}

Assistant:

void InitializeKeyValue(T* v, const U&... init) {
    ::new (static_cast<void*>(v)) T(init...);
    if constexpr (std::is_same_v<std::string, T>) {
      if (arena() != nullptr) {
        arena()->OwnDestructor(v);
      }
    }
  }